

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall
spvtools::val::Function::Function
          (Function *this,uint32_t function_id,uint32_t result_type_id,
          FunctionControlMask function_control,uint32_t function_type_id)

{
  _Rb_tree_header *p_Var1;
  
  this->id_ = function_id;
  this->function_type_id_ = function_type_id;
  this->result_type_id_ = result_type_id;
  this->function_control_ = function_control;
  this->declaration_type_ = kFunctionDeclUnknown;
  this->end_has_been_registered_ = false;
  *(undefined8 *)&(this->blocks_)._M_h._M_rehash_policy = 0;
  (this->blocks_)._M_h._M_buckets = &(this->blocks_)._M_h._M_single_bucket;
  (this->blocks_)._M_h._M_bucket_count = 1;
  (this->blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->blocks_)._M_h._M_element_count = 0;
  (this->blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ordered_blocks_).
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ordered_blocks_).
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ordered_blocks_).
  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->undefined_blocks_)._M_h._M_buckets = &(this->undefined_blocks_)._M_h._M_single_bucket;
  (this->undefined_blocks_)._M_h._M_bucket_count = 1;
  (this->undefined_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->undefined_blocks_)._M_h._M_element_count = 0;
  (this->undefined_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->current_block_ = (BasicBlock *)0x0;
  (this->undefined_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->undefined_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  BasicBlock::BasicBlock(&this->pseudo_entry_block_,0);
  BasicBlock::BasicBlock(&this->pseudo_exit_block_,0x400000);
  (this->augmented_successors_map_)._M_h._M_buckets =
       &(this->augmented_successors_map_)._M_h._M_single_bucket;
  (this->augmented_successors_map_)._M_h._M_bucket_count = 1;
  (this->augmented_successors_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->augmented_successors_map_)._M_h._M_element_count = 0;
  (this->augmented_successors_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->augmented_successors_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->augmented_successors_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->augmented_predecessors_map_)._M_h._M_buckets =
       &(this->augmented_predecessors_map_)._M_h._M_single_bucket;
  (this->augmented_predecessors_map_)._M_h._M_bucket_count = 1;
  (this->augmented_predecessors_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->augmented_predecessors_map_)._M_h._M_element_count = 0;
  (this->augmented_predecessors_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->augmented_predecessors_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->augmented_predecessors_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->loop_header_successors_plus_continue_target_map_)._M_h._M_buckets =
       &(this->loop_header_successors_plus_continue_target_map_)._M_h._M_single_bucket;
  (this->loop_header_successors_plus_continue_target_map_)._M_h._M_bucket_count = 1;
  (this->loop_header_successors_plus_continue_target_map_)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->loop_header_successors_plus_continue_target_map_)._M_h._M_element_count = 0;
  (this->loop_header_successors_plus_continue_target_map_)._M_h._M_rehash_policy._M_max_load_factor
       = 1.0;
  (this->loop_header_successors_plus_continue_target_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loop_header_successors_plus_continue_target_map_)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (this->cfg_constructs_).
  super__List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->cfg_constructs_;
  (this->cfg_constructs_).
  super__List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->cfg_constructs_;
  (this->cfg_constructs_).
  super__List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_>._M_impl.
  _M_node._M_size = 0;
  (this->variable_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variable_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variable_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameter_ids_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entry_block_to_construct_)._M_h._M_buckets =
       &(this->entry_block_to_construct_)._M_h._M_single_bucket;
  (this->entry_block_to_construct_)._M_h._M_bucket_count = 1;
  (this->entry_block_to_construct_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->entry_block_to_construct_)._M_h._M_element_count = 0;
  (this->entry_block_to_construct_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->entry_block_to_construct_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->entry_block_to_construct_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->merge_block_header_)._M_h._M_buckets = &(this->merge_block_header_)._M_h._M_single_bucket;
  (this->merge_block_header_)._M_h._M_bucket_count = 1;
  (this->merge_block_header_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->merge_block_header_)._M_h._M_element_count = 0;
  (this->merge_block_header_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->merge_block_header_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->merge_block_header_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->continue_target_headers_)._M_h._M_buckets =
       &(this->continue_target_headers_)._M_h._M_single_bucket;
  (this->continue_target_headers_)._M_h._M_bucket_count = 1;
  (this->continue_target_headers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->continue_target_headers_)._M_h._M_element_count = 0;
  (this->continue_target_headers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->continue_target_headers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->continue_target_headers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_depth_)._M_h._M_buckets = &(this->block_depth_)._M_h._M_single_bucket;
  (this->block_depth_)._M_h._M_bucket_count = 1;
  (this->block_depth_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_depth_)._M_h._M_element_count = 0;
  (this->block_depth_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_depth_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_depth_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->execution_model_limitations_).
  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->execution_model_limitations_;
  (this->execution_model_limitations_).
  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->execution_model_limitations_;
  (this->execution_model_limitations_).
  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->limitations_).
  super__List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->limitations_;
  (this->limitations_).
  super__List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->limitations_;
  (this->limitations_).
  super__List_base<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var1 = &(this->function_call_targets_)._M_t._M_impl.super__Rb_tree_header;
  (this->function_call_targets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->function_call_targets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->function_call_targets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->function_call_targets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->function_call_targets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Function::Function(uint32_t function_id, uint32_t result_type_id,
                   spv::FunctionControlMask function_control,
                   uint32_t function_type_id)
    : id_(function_id),
      function_type_id_(function_type_id),
      result_type_id_(result_type_id),
      function_control_(function_control),
      declaration_type_(FunctionDecl::kFunctionDeclUnknown),
      end_has_been_registered_(false),
      blocks_(),
      current_block_(nullptr),
      pseudo_entry_block_(0),
      pseudo_exit_block_(kInvalidId),
      cfg_constructs_(),
      variable_ids_(),
      parameter_ids_() {}